

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

size_t CLI::detail::close_string_quote(string *str,size_t start,char closure_char)

{
  char cVar1;
  ulong uVar2;
  
  while( true ) {
    uVar2 = start;
    start = uVar2 + 1;
    if ((str->_M_string_length <= start) ||
       (cVar1 = (str->_M_dataplus)._M_p[start], cVar1 == closure_char)) break;
    if (cVar1 == '\\') {
      start = uVar2 + 2;
    }
  }
  return start;
}

Assistant:

CLI11_INLINE std::size_t close_string_quote(const std::string &str, std::size_t start, char closure_char) {
    std::size_t loc{0};
    for(loc = start + 1; loc < str.size(); ++loc) {
        if(str[loc] == closure_char) {
            break;
        }
        if(str[loc] == '\\') {
            // skip the next character for escaped sequences
            ++loc;
        }
    }
    return loc;
}